

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_parse_check(arg_hdr **table,arg_end *endtable)

{
  int iVar1;
  arg_checkfn *paVar2;
  void *pvVar3;
  arg_hdr *paVar4;
  int iVar5;
  long lVar6;
  
  do {
    paVar2 = (*table)->checkfn;
    if (paVar2 != (arg_checkfn *)0x0) {
      pvVar3 = (*table)->parent;
      iVar5 = (*paVar2)(pvVar3);
      if (iVar5 != 0) {
        iVar1 = (endtable->hdr).maxcount;
        if (endtable->count < iVar1) {
          endtable->error[endtable->count] = iVar5;
          iVar5 = endtable->count;
          endtable->parent[iVar5] = pvVar3;
          endtable->argval[iVar5] = (char *)0x0;
          endtable->count = iVar5 + 1;
        }
        else {
          endtable->error[(long)iVar1 + -1] = 1;
          lVar6 = (long)(endtable->hdr).maxcount;
          endtable->parent[lVar6 + -1] = endtable;
          endtable->argval[lVar6 + -1] = (char *)0x0;
        }
      }
    }
    paVar4 = *table;
    table = table + 1;
  } while ((paVar4->flag & 1U) == 0);
  return;
}

Assistant:

static void arg_parse_check(struct arg_hdr** table, struct arg_end* endtable) {
    int tabindex = 0;
    /* printf("arg_parse_check()\n"); */
    do {
        if (table[tabindex]->checkfn) {
            void* parent = table[tabindex]->parent;
            int errorcode = table[tabindex]->checkfn(parent);
            if (errorcode != 0)
                arg_register_error(endtable, parent, errorcode, NULL);
        }
    } while (!(table[tabindex++]->flag & ARG_TERMINATOR));
}